

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_util.c
# Opt level: O2

lzma_ret lzma_block_compressed_size(lzma_block *block,lzma_vli unpadded_size)

{
  uint32_t uVar1;
  uint32_t uVar2;
  lzma_ret lVar3;
  lzma_vli lVar4;
  ulong uVar5;
  
  lVar4 = lzma_block_unpadded_size(block);
  if (lVar4 == 0) {
    lVar3 = LZMA_PROG_ERROR;
  }
  else {
    uVar1 = block->header_size;
    uVar2 = lzma_check_size(block->check);
    uVar5 = (ulong)(uVar2 + uVar1);
    lVar3 = LZMA_DATA_ERROR;
    lVar4 = unpadded_size - uVar5;
    if ((uVar5 <= unpadded_size && lVar4 != 0) &&
       ((block->compressed_size == 0xffffffffffffffff || (block->compressed_size == lVar4)))) {
      block->compressed_size = lVar4;
      lVar3 = LZMA_OK;
    }
  }
  return lVar3;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_compressed_size(lzma_block *block, lzma_vli unpadded_size)
{
	// Validate everything but Uncompressed Size and filters.
	if (lzma_block_unpadded_size(block) == 0)
		return LZMA_PROG_ERROR;

	const uint32_t container_size = block->header_size
			+ lzma_check_size(block->check);

	// Validate that Compressed Size will be greater than zero.
	if (unpadded_size <= container_size)
		return LZMA_DATA_ERROR;

	// Calculate what Compressed Size is supposed to be.
	// If Compressed Size was present in Block Header,
	// compare that the new value matches it.
	const lzma_vli compressed_size = unpadded_size - container_size;
	if (block->compressed_size != LZMA_VLI_UNKNOWN
			&& block->compressed_size != compressed_size)
		return LZMA_DATA_ERROR;

	block->compressed_size = compressed_size;

	return LZMA_OK;
}